

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O0

int yy_comp_init(GREG *G)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int yythunkpos1052;
  int yypos1052;
  int yythunkpos1049;
  int yypos1049;
  int yythunkpos1047;
  int yypos1047;
  int yythunkpos1045;
  int yypos1045;
  int yythunkpos1043;
  int yypos1043;
  int yythunkpos1041;
  int yypos1041;
  int yythunkpos0;
  int yypos0;
  GREG *G_local;
  
  iVar1 = G->pos;
  iVar2 = G->thunkpos;
  yyDo(G,yyPush,1,0,"yyPush");
  iVar7 = G->pos;
  iVar3 = G->thunkpos;
  iVar6 = G->pos;
  iVar4 = G->thunkpos;
  iVar5 = yy_BOM(G);
  if (iVar5 == 0) {
    G->pos = iVar6;
    G->thunkpos = iVar4;
  }
  iVar6 = G->pos;
  iVar4 = G->thunkpos;
  iVar5 = yy_pod(G);
  if (iVar5 == 0) {
    G->pos = iVar6;
    G->thunkpos = iVar4;
  }
  iVar6 = yy_statementlist(G);
  if (iVar6 != 0) {
    yyDo(G,yySet,-1,0,"yySet");
    iVar6 = yy__(G);
    if ((iVar6 != 0) && (iVar6 = yy_end_of_file(G), iVar6 != 0)) {
      yyDo(G,yy_1_comp_init,G->begin,G->end,"yy_1_comp_init");
      goto LAB_00104e17;
    }
  }
  G->pos = iVar7;
  G->thunkpos = iVar3;
  iVar7 = G->pos;
  iVar3 = G->thunkpos;
  iVar6 = yy_BOM(G);
  if (iVar6 == 0) {
    G->pos = iVar7;
    G->thunkpos = iVar3;
  }
  iVar7 = G->pos;
  iVar3 = G->thunkpos;
  iVar6 = yy_pod(G);
  if (iVar6 == 0) {
    G->pos = iVar7;
    G->thunkpos = iVar3;
  }
  do {
    iVar7 = G->pos;
    iVar3 = G->thunkpos;
    iVar6 = yy_ws(G);
  } while (iVar6 != 0);
  G->pos = iVar7;
  G->thunkpos = iVar3;
  iVar7 = yy_end_of_file(G);
  if (iVar7 == 0) {
    G->pos = iVar1;
    G->thunkpos = iVar2;
    return 0;
  }
  yyDo(G,yy_2_comp_init,G->begin,G->end,"yy_2_comp_init");
LAB_00104e17:
  yyDo(G,yyPop,1,0,"yyPop");
  return 1;
}

Assistant:

YY_RULE(int) yy_comp_init(GREG *G)
{  int yypos0= G->pos, yythunkpos0= G->thunkpos;  yyDo(G, yyPush, 1, 0, "yyPush");
  yyprintfv((stderr, "%s\n", "comp_init"));

  {  int yypos1041= G->pos, yythunkpos1041= G->thunkpos;
  {  int yypos1043= G->pos, yythunkpos1043= G->thunkpos;  if (!yy_BOM(G))  goto l1043;
  goto l1044;
  l1043:;	  G->pos= yypos1043; G->thunkpos= yythunkpos1043;
  }
  l1044:;	
  {  int yypos1045= G->pos, yythunkpos1045= G->thunkpos;  if (!yy_pod(G))  goto l1045;
  goto l1046;
  l1045:;	  G->pos= yypos1045; G->thunkpos= yythunkpos1045;
  }
  l1046:;	  if (!yy_statementlist(G))  goto l1042;
  yyDo(G, yySet, -1, 0, "yySet");
  if (!yy__(G))  goto l1042;
  if (!yy_end_of_file(G))  goto l1042;
  yyDo(G, yy_1_comp_init, G->begin, G->end, "yy_1_comp_init");
  goto l1041;
  l1042:;	  G->pos= yypos1041; G->thunkpos= yythunkpos1041;
  {  int yypos1047= G->pos, yythunkpos1047= G->thunkpos;  if (!yy_BOM(G))  goto l1047;
  goto l1048;
  l1047:;	  G->pos= yypos1047; G->thunkpos= yythunkpos1047;
  }
  l1048:;	
  {  int yypos1049= G->pos, yythunkpos1049= G->thunkpos;  if (!yy_pod(G))  goto l1049;
  goto l1050;
  l1049:;	  G->pos= yypos1049; G->thunkpos= yythunkpos1049;
  }
  l1050:;	
  l1051:;	
  {  int yypos1052= G->pos, yythunkpos1052= G->thunkpos;  if (!yy_ws(G))  goto l1052;
  goto l1051;
  l1052:;	  G->pos= yypos1052; G->thunkpos= yythunkpos1052;
  }  if (!yy_end_of_file(G))  goto l1040;
  yyDo(G, yy_2_comp_init, G->begin, G->end, "yy_2_comp_init");

  }
  l1041:;	  yyprintf((stderr, "  ok   comp_init"));
  yyprintfGcontext;
  yyprintf((stderr, "\n"));
  yyDo(G, yyPop, 1, 0, "yyPop");
  return 1;
  l1040:;	  G->pos= yypos0; G->thunkpos= yythunkpos0;  yyprintfv((stderr, "  fail %s", "comp_init"));
  yyprintfvGcontext;
  yyprintfv((stderr, "\n"));

  return 0;
}